

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::ServiceOptions::_InternalSerialize
          (ServiceOptions *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  FeatureSet *value;
  ulong uVar4;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>_>
  *value_00;
  uint8_t *puVar5;
  int index;
  
  uVar2 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar2 & 2) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = (this->field_0)._impl_.deprecated_;
    target[0] = 0x88;
    target[1] = '\x02';
    target[2] = bVar1;
    target = target + 3;
  }
  if ((uVar2 & 1) != 0) {
    value = (this->field_0)._impl_.features_;
    target = internal::WireFormatLite::InternalWriteMessage
                       (0x22,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target
                        ,stream);
  }
  iVar3 = *(int *)((long)&this->field_0 + 0x28);
  if (iVar3 != 0) {
    index = 0;
    do {
      value_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::UninterpretedOption>>
                           (&(this->field_0)._impl_.uninterpreted_option_.super_RepeatedPtrFieldBase
                            ,index);
      target = internal::WireFormatLite::InternalWriteMessage
                         (999,(MessageLite *)value_00,(value_00->field_0)._impl_._cached_size_.atom_
                          ,target,stream);
      index = index + 1;
    } while (iVar3 != index);
  }
  if (*(short *)((long)&this->field_0 + 10) != 0) {
    target = internal::ExtensionSet::_InternalSerializeAllImpl
                       (&(this->field_0)._impl_._extensions_,
                        (MessageLite *)_ServiceOptions_default_instance_,target,stream);
  }
  uVar4 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar4 & 1) == 0) {
    return target;
  }
  puVar5 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar4 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar5;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL ServiceOptions::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const ServiceOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.ServiceOptions)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional bool deprecated = 33 [default = false];
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteBoolToArray(
        33, this_._internal_deprecated(), target);
  }

  // optional .google.protobuf.FeatureSet features = 34;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        34, *this_._impl_.features_, this_._impl_.features_->GetCachedSize(), target,
        stream);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_uninterpreted_option_size());
       i < n; i++) {
    const auto& repfield = this_._internal_uninterpreted_option().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            999, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.ServiceOptions)
  return target;
}